

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::RegisterAllTypes(Metadata *file_level_metadata,int size)

{
  long lVar1;
  long lVar2;
  
  if (0 < size) {
    lVar2 = 0;
    do {
      lVar1 = *(long *)((long)&file_level_metadata->reflection + lVar2);
      if (lVar1 != 0) {
        MessageFactory::InternalRegisterGeneratedMessage
                  (*(Descriptor **)((long)&file_level_metadata->descriptor + lVar2),
                   *(Message **)(lVar1 + 0x10));
      }
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(uint)size << 4 != lVar2);
  }
  return;
}

Assistant:

void RegisterAllTypesInternal(const Metadata* file_level_metadata, int size) {
  for (int i = 0; i < size; i++) {
    const GeneratedMessageReflection* reflection =
        static_cast<const GeneratedMessageReflection*>(
           file_level_metadata[i].reflection);
    if (reflection) {
      // It's not a map type
      ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
          file_level_metadata[i].descriptor,
          reflection->schema_.default_instance_);
    }
  }
}